

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O0

void __thiscall
Lib::Exception::
Exception<char_const*,char_const*,char_const*,std::__cxx11::string,char_const*,unsigned_int>
          (Exception *this,char *msg,char *msg_1,char *msg_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg_3,char *msg_4,
          uint msg_5)

{
  string *in_R8;
  string *in_R9;
  undefined4 in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000128;
  char *in_stack_00000130;
  char *in_stack_00000138;
  char *in_stack_00000140;
  Exception *in_stack_00000148;
  char *in_stack_00000160;
  uint in_stack_00000168;
  undefined4 in_stack_ffffffffffffff44;
  string local_70 [32];
  string local_50 [32];
  string *local_30;
  
  local_30 = in_R9;
  std::__cxx11::string::string(local_70,in_R8);
  toString<char_const*,char_const*,char_const*,std::__cxx11::string,char_const*,unsigned_int>
            (in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130,
             in_stack_00000128,in_stack_00000160,in_stack_00000168);
  Exception((Exception *)CONCAT44(in_stack_ffffffffffffff44,in_stack_00000008),local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

explicit Exception(Msg... msg)
   : Exception(toString(msg...))
  { }